

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadsavemenu.cpp
# Opt level: O2

void DLoadSaveMenu::NotifyNewSave(char *file,char *title,bool okForQuicksave)

{
  int iVar1;
  uint uVar2;
  FSaveGameNode *__dest;
  ulong uVar3;
  
  if (file != (char *)0x0) {
    ReadSaveStrings();
    for (uVar3 = 0; uVar3 < SaveGames.Count; uVar3 = uVar3 + 1) {
      __dest = SaveGames.Array[uVar3];
      iVar1 = FString::Compare(&__dest->Filename,file);
      if (iVar1 == 0) {
        strcpy(__dest->Title,title);
        __dest->bOldVersion = false;
        __dest->bMissingWads = false;
        if (!okForQuicksave) {
          return;
        }
        goto LAB_00353945;
      }
    }
    __dest = (FSaveGameNode *)operator_new(0x28);
    (__dest->Filename).Chars = FString::NullString.Nothing;
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    __dest->bNoDelete = false;
    strcpy((char *)__dest,title);
    FString::operator=(&__dest->Filename,file);
    __dest->bOldVersion = false;
    __dest->bMissingWads = false;
    uVar2 = InsertSaveNode((FSaveGameNode *)0x353927);
    if (okForQuicksave) {
      uVar3 = (ulong)uVar2;
LAB_00353945:
      if (quickSaveSlot == (FSaveGameNode *)0x0) {
        quickSaveSlot = __dest;
      }
      LastSaved = (int)uVar3;
      LastAccessed = LastSaved;
    }
  }
  return;
}

Assistant:

void DLoadSaveMenu::NotifyNewSave (const char *file, const char *title, bool okForQuicksave)
{
	FSaveGameNode *node;

	if (file == NULL)
		return;

	ReadSaveStrings ();

	// See if the file is already in our list
	for (unsigned i=0; i<SaveGames.Size(); i++)
	{
		FSaveGameNode *node = SaveGames[i];
#ifdef __unix__
		if (node->Filename.Compare (file) == 0)
#else
		if (node->Filename.CompareNoCase (file) == 0)
#endif
		{
			strcpy (node->Title, title);
			node->bOldVersion = false;
			node->bMissingWads = false;
			if (okForQuicksave)
			{
				if (quickSaveSlot == NULL) quickSaveSlot = node;
				LastAccessed = LastSaved = i;
			}
			return;
		}
	}

	node = new FSaveGameNode;
	strcpy (node->Title, title);
	node->Filename = file;
	node->bOldVersion = false;
	node->bMissingWads = false;
	int index = InsertSaveNode (node);

	if (okForQuicksave)
	{
		if (quickSaveSlot == NULL) quickSaveSlot = node;
		LastAccessed = LastSaved = index;
	}
}